

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall tonk::Connection::OnUnauthenticatedHandshake(Connection *this)

{
  uint in_EDX;
  uint8_t *in_RSI;
  
  OnUnauthenticatedHandshake
            ((Connection *)(this[-1].CachedLocalAddress.NetworkString + 0x14),in_RSI,in_EDX);
  return;
}

Assistant:

HandshakeResult Connection::OnUnauthenticatedHandshake(const uint8_t* data, const unsigned bytes)
{
    /*
        Note that all of this processing is not from authenticated data so
        it could have come from anywhere.  The impact of processing this
        data should be minimal and restricted mainly to cases where the
        peer is not reachable or connection handshake is ongoing.
    */

    static const unsigned kHandshakeRightOffset = protocol::kUntaggedDatagramBytes + protocol::kHandshakeBytes;
    if (bytes < kHandshakeRightOffset)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return HandshakeResult::DropDatagram;
    }
    const uint8_t* handshakeData = data + bytes - kHandshakeRightOffset;
    const protocol::HandshakeType type = protocol::handshake::GetType(handshakeData);

    if (type == protocol::HandshakeType_S2CUnknownSourceAddress)
    {
        Logger.Debug("Server did not recognize our source address");

        /*
            Server did not recognize our source address.  This happens if we
            changed IP source address or source port without realizing it.
            This can happen in practice if a mobile device is rehoming under
            a new NAT address.  We will need to start attaching our Connection
            Id to outgoing datagrams.
        */
        if (RemoteAssignedIdForLocalHost != TONK_INVALID_ID)
        {
            Outgoing.StartHandshakeC2SUpdateSourceAddress(
                EncryptionKey,
                RemoteAssignedIdForLocalHost);
        }
        return HandshakeResult::DropDatagram;
    }

    if (type == protocol::HandshakeType_Disconnect)
    {
        const uint64_t key = protocol::handshake::GetKey(handshakeData);
        if (key != EncryptionKey)
        {
            Logger.Warning("Ignoring disconnect with wrong key = ", HexString(key));
            return HandshakeResult::DropDatagram;
        }

        if (ConnectionEstablished)
        {
            Logger.Warning("Ignoring handshake disconnect after connection established");
            return HandshakeResult::DropDatagram;
        }

        SelfRefCount.StartShutdown(
            Tonk_ConnectionRejected,
            Result("Disconnected",
                "Connection rejected by peer (server full?)",
                ErrorType::Tonk,
                Tonk_ConnectionRejected));
        return HandshakeResult::DropDatagram;
    }

    if (type == protocol::HandshakeType_S2CCookieResponse)
    {
        if (ConnectionEstablished)
        {
            Logger.Warning("Ignoring S2C cookie response after connection established");
            return HandshakeResult::DropDatagram;
        }

        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        // Update our encryption key to match
        EncryptionKey = key;
        Outgoing.ChangeEncryptionKey(key);
        Incoming.ChangeEncryptionKey(key);

        // Start attaching new handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(key);

        // Cookie responses contain no other data
        return HandshakeResult::DropDatagram;
    }

    // Ignore other types
    return HandshakeResult::ContinueProcessing;
}